

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

bool Diligent::TextureComponentMappingFromString
               (String *MappingStr,TextureComponentMapping *Mapping)

{
  byte bVar1;
  ulong uVar2;
  pointer pcVar3;
  ulong uVar4;
  TEXTURE_COMPONENT_SWIZZLE TVar5;
  byte bVar6;
  bool bVar7;
  
  Mapping->R = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
  Mapping->G = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
  Mapping->B = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
  Mapping->A = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
  uVar2 = MappingStr->_M_string_length;
  bVar7 = uVar2 < 5;
  if (uVar2 != 0) {
    pcVar3 = (MappingStr->_M_dataplus)._M_p;
    uVar4 = 0;
    do {
      bVar1 = pcVar3[uVar4];
      bVar6 = bVar1 & 0xdf;
      if (bVar6 < 0x47) {
        if (bVar6 == 0x41) {
          TVar5 = TEXTURE_COMPONENT_SWIZZLE_A;
          if (uVar4 == 3) {
            TVar5 = TEXTURE_COMPONENT_SWIZZLE_IDENTITY;
          }
          goto LAB_005107eb;
        }
        if (bVar6 == 0x42) {
          TVar5 = (uVar4 != 2) * '\x05';
          goto LAB_005107eb;
        }
LAB_005107b9:
        if (bVar1 == 0x30) {
          TVar5 = TEXTURE_COMPONENT_SWIZZLE_ZERO;
          goto LAB_005107eb;
        }
        if (bVar1 == 0x31) {
          TVar5 = TEXTURE_COMPONENT_SWIZZLE_ONE;
          goto LAB_005107eb;
        }
        bVar7 = false;
      }
      else {
        if (bVar6 == 0x47) {
          TVar5 = (uVar4 != 1) << 2;
        }
        else {
          if (bVar6 != 0x52) goto LAB_005107b9;
          TVar5 = (uVar4 != 0) * '\x03';
        }
LAB_005107eb:
        (&Mapping->R)[uVar4] = TVar5;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  return bVar7;
}

Assistant:

bool TextureComponentMappingFromString(const String& MappingStr, TextureComponentMapping& Mapping)
{
    Mapping = TextureComponentMapping::Identity();

    bool AllOK = MappingStr.length() <= 4;

    for (size_t Comp = 0; Comp < MappingStr.length(); ++Comp)
    {
        const char Chr = MappingStr[Comp];
        if (Chr == 'r' || Chr == 'R')
            Mapping[Comp] = Comp == 0 ? TEXTURE_COMPONENT_SWIZZLE_IDENTITY : TEXTURE_COMPONENT_SWIZZLE_R;
        else if (Chr == 'g' || Chr == 'G')
            Mapping[Comp] = Comp == 1 ? TEXTURE_COMPONENT_SWIZZLE_IDENTITY : TEXTURE_COMPONENT_SWIZZLE_G;
        else if (Chr == 'b' || Chr == 'B')
            Mapping[Comp] = Comp == 2 ? TEXTURE_COMPONENT_SWIZZLE_IDENTITY : TEXTURE_COMPONENT_SWIZZLE_B;
        else if (Chr == 'a' || Chr == 'A')
            Mapping[Comp] = Comp == 3 ? TEXTURE_COMPONENT_SWIZZLE_IDENTITY : TEXTURE_COMPONENT_SWIZZLE_A;
        else if (Chr == '0')
            Mapping[Comp] = TEXTURE_COMPONENT_SWIZZLE_ZERO;
        else if (Chr == '1')
            Mapping[Comp] = TEXTURE_COMPONENT_SWIZZLE_ONE;
        else
            AllOK = false;
    }
    return AllOK;
}